

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

SelectionVectorHelper * __thiscall
duckdb::ReservoirSample::GetReplacementIndexesSlow
          (SelectionVectorHelper *__return_storage_ptr__,ReservoirSample *this,
          idx_t sample_chunk_offset,idx_t chunk_length)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  idx_t iVar1;
  __node_base _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar3;
  SelectionVectorHelper *pSVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  pointer pBVar7;
  mapped_type *pmVar8;
  pointer pBVar9;
  ulong uVar10;
  sel_t *psVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  pair<double,_unsigned_long> pVar13;
  SelectionVector ret_sel;
  SelectionVectorHelper *ret;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ret_map;
  mapped_type local_d0;
  SelectionVector local_c8;
  SelectionVectorHelper *local_b0;
  idx_t local_a8;
  ulong local_a0;
  sel_t *local_98;
  double local_90;
  shared_ptr<duckdb::SelectionData,_true> local_88;
  undefined1 local_78 [16];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  psVar11 = (sel_t *)0x0;
  local_d0 = 0;
  local_b0 = __return_storage_ptr__;
  local_a8 = sample_chunk_offset;
  do {
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    iVar1 = pBVar7->next_index_to_sample;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    uVar12 = iVar1 - pBVar7->num_entries_to_skip_b4_next_sample;
    if (chunk_length < uVar12 || chunk_length - uVar12 == 0) {
      pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_00);
      pBVar7->num_entries_to_skip_b4_next_sample =
           pBVar7->num_entries_to_skip_b4_next_sample + chunk_length;
      uVar10 = chunk_length;
    }
    else {
      local_c8.sel_vector = (sel_t *)((long)psVar11 + uVar12);
      local_98 = local_c8.sel_vector;
      pmVar8 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)&local_c8);
      *pmVar8 = local_d0;
      pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_00);
      pBVar9 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_00);
      dVar3 = RandomEngine::NextRandom32((RandomEngine *)pBVar7,pBVar9->min_weight_threshold,1.0);
      local_78._8_4_ = extraout_XMM0_Dc;
      local_78._0_8_ = dVar3;
      local_78._12_4_ = extraout_XMM0_Dd;
      local_a0 = chunk_length;
      pVar13 = BlockingSample::PopFromWeightQueue(&this->super_BlockingSample);
      (this->sel).sel_vector[(long)pVar13.second] = (int)local_a8 + (int)local_d0;
      pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_00);
      local_90 = -local_78._0_8_;
      local_c8.sel_vector = (sel_t *)pVar13.second;
      ::std::
      priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
      ::emplace<double,unsigned_long&>
                ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
                  *)&pBVar7->reservoir_weights,&local_90,(unsigned_long *)&local_c8);
      BaseReservoirSampling::SetNextEntry(pBVar7);
      local_d0 = local_d0 + 1;
      uVar10 = local_a0;
      chunk_length = chunk_length - uVar12;
      psVar11 = local_98;
    }
  } while (uVar12 < uVar10);
  SelectionVector::SelectionVector(&local_c8,local_68._M_element_count);
  pSVar4 = local_b0;
  for (_Var2._M_nxt = local_68._M_before_begin._M_nxt; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    local_c8.sel_vector[(long)_Var2._M_nxt[2]._M_nxt] = *(sel_t *)&_Var2._M_nxt[1]._M_nxt;
  }
  (local_b0->sel).sel_vector = (sel_t *)0x0;
  (local_b0->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (local_b0->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  shared_ptr<duckdb::SelectionData,_true>::operator=(&local_88,&local_c8.selection_data);
  _Var6._M_pi = local_88.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar5 = local_88.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (pSVar4->sel).sel_vector = local_c8.sel_vector;
  local_90 = 0.0;
  local_88.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pSVar4->sel).selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pSVar4->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (pSVar4->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (local_88.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pSVar4->size = (uint32_t)local_68._M_element_count;
  if (local_c8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return pSVar4;
}

Assistant:

SelectionVectorHelper ReservoirSample::GetReplacementIndexesSlow(const idx_t sample_chunk_offset,
                                                                 const idx_t chunk_length) {
	idx_t remaining = chunk_length;
	std::unordered_map<idx_t, idx_t> ret_map;
	idx_t sample_chunk_index = 0;

	idx_t base_offset = 0;

	while (true) {
		idx_t offset =
		    base_reservoir_sample->next_index_to_sample - base_reservoir_sample->num_entries_to_skip_b4_next_sample;
		if (offset >= remaining) {
			// not in this chunk! increment current count and go to the next chunk
			base_reservoir_sample->num_entries_to_skip_b4_next_sample += remaining;
			break;
		}
		// in this chunk! replace the element
		// ret[index_in_new_chunk] = index_in_sample_chunk (the sample chunk offset will be applied later)
		// D_ASSERT(sample_chunk_index == ret.size());
		ret_map[base_offset + offset] = sample_chunk_index;
		double r2 = base_reservoir_sample->random.NextRandom32(base_reservoir_sample->min_weight_threshold, 1);
		// replace element in our max_heap
		// first get the top most pair
		const auto top = PopFromWeightQueue();
		const auto index = top.second;
		const auto index_in_sample_chunk = sample_chunk_offset + sample_chunk_index;
		sel.set_index(index, index_in_sample_chunk);
		base_reservoir_sample->ReplaceElementWithIndex(index, r2, false);

		sample_chunk_index += 1;
		// shift the chunk forward
		remaining -= offset;
		base_offset += offset;
	}

	// create selection vector to return
	SelectionVector ret_sel(ret_map.size());
	D_ASSERT(sel_size == sample_count);
	for (auto &kv : ret_map) {
		ret_sel.set_index(kv.second, kv.first);
	}
	SelectionVectorHelper ret;
	ret.sel = SelectionVector(ret_sel);
	ret.size = static_cast<uint32_t>(ret_map.size());
	return ret;
}